

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

bool embree::avx::
     BVHNIntersector1<8,_16777232,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiMBIntersector1Pluecker<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  Geometry *this;
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  bool bVar11;
  byte bVar12;
  bool bVar13;
  ulong uVar14;
  undefined1 (*pauVar15) [16];
  ulong uVar16;
  long lVar17;
  undefined1 (*pauVar18) [16];
  long lVar19;
  uint uVar20;
  size_t i;
  long lVar21;
  byte bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  float fVar38;
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  undefined1 auVar41 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 in_ZMM4 [64];
  float fVar51;
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  undefined1 in_ZMM5 [64];
  undefined1 auVar60 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 in_ZMM12 [64];
  undefined1 auVar64 [64];
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2530 [16];
  undefined1 local_2500 [8];
  float fStack_24f8;
  float fStack_24f4;
  float fStack_24f0;
  float fStack_24ec;
  float fStack_24e8;
  float fStack_24e4;
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  float local_24a0;
  float fStack_249c;
  float fStack_2498;
  float fStack_2494;
  float fStack_2490;
  float fStack_248c;
  float fStack_2488;
  float fStack_2484;
  undefined1 local_2480 [32];
  float local_2460;
  float fStack_245c;
  float fStack_2458;
  float fStack_2454;
  float fStack_2450;
  float fStack_244c;
  float fStack_2448;
  float fStack_2444;
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  undefined1 auVar37 [64];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 == 8) {
    return false;
  }
  uStack_2398 = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_2530 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar2 = (context->query_radius).field_0;
    local_2530 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  }
  uVar1 = *(undefined4 *)&(query->p).field_0;
  local_23e0._4_4_ = uVar1;
  local_23e0._0_4_ = uVar1;
  local_23e0._8_4_ = uVar1;
  local_23e0._12_4_ = uVar1;
  local_23e0._16_4_ = uVar1;
  local_23e0._20_4_ = uVar1;
  local_23e0._24_4_ = uVar1;
  local_23e0._28_4_ = uVar1;
  auVar61 = ZEXT3264(local_23e0);
  uVar1 = *(undefined4 *)((long)&(query->p).field_0 + 4);
  local_2400._4_4_ = uVar1;
  local_2400._0_4_ = uVar1;
  local_2400._8_4_ = uVar1;
  local_2400._12_4_ = uVar1;
  local_2400._16_4_ = uVar1;
  local_2400._20_4_ = uVar1;
  local_2400._24_4_ = uVar1;
  local_2400._28_4_ = uVar1;
  auVar62 = ZEXT3264(local_2400);
  uVar1 = *(undefined4 *)((long)&(query->p).field_0 + 8);
  local_2420._4_4_ = uVar1;
  local_2420._0_4_ = uVar1;
  local_2420._8_4_ = uVar1;
  local_2420._12_4_ = uVar1;
  local_2420._16_4_ = uVar1;
  local_2420._20_4_ = uVar1;
  local_2420._24_4_ = uVar1;
  local_2420._28_4_ = uVar1;
  auVar63 = ZEXT3264(local_2420);
  uVar1 = *(undefined4 *)&(context->query_radius).field_0;
  auVar25._4_4_ = uVar1;
  auVar25._0_4_ = uVar1;
  auVar25._8_4_ = uVar1;
  auVar25._12_4_ = uVar1;
  auVar25._16_4_ = uVar1;
  auVar25._20_4_ = uVar1;
  auVar25._24_4_ = uVar1;
  auVar25._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar28._4_4_ = uVar1;
  auVar28._0_4_ = uVar1;
  auVar28._8_4_ = uVar1;
  auVar28._12_4_ = uVar1;
  auVar28._16_4_ = uVar1;
  auVar28._20_4_ = uVar1;
  auVar28._24_4_ = uVar1;
  auVar28._28_4_ = uVar1;
  pauVar18 = (undefined1 (*) [16])local_2390;
  uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar33._4_4_ = uVar1;
  auVar33._0_4_ = uVar1;
  auVar33._8_4_ = uVar1;
  auVar33._12_4_ = uVar1;
  auVar33._16_4_ = uVar1;
  auVar33._20_4_ = uVar1;
  auVar33._24_4_ = uVar1;
  auVar33._28_4_ = uVar1;
  bVar13 = false;
  do {
    auVar37 = ZEXT3264(auVar33);
    local_2440 = vsubps_avx(auVar61._0_32_,auVar25);
    fVar38 = auVar25._0_4_;
    fVar42 = auVar25._4_4_;
    fVar43 = auVar25._8_4_;
    fVar44 = auVar25._12_4_;
    fVar45 = auVar25._16_4_;
    fVar46 = auVar25._20_4_;
    fVar47 = auVar25._24_4_;
    local_2460 = auVar61._0_4_ + fVar38;
    fStack_245c = auVar61._4_4_ + fVar42;
    fStack_2458 = auVar61._8_4_ + fVar43;
    fStack_2454 = auVar61._12_4_ + fVar44;
    fStack_2450 = auVar61._16_4_ + fVar45;
    fStack_244c = auVar61._20_4_ + fVar46;
    fStack_2448 = auVar61._24_4_ + fVar47;
    fStack_2444 = auVar61._28_4_ + auVar25._28_4_;
    local_2480 = vsubps_avx(auVar62._0_32_,auVar28);
    auVar41 = ZEXT3264(local_2480);
    local_24a0 = auVar62._0_4_ + auVar28._0_4_;
    fStack_249c = auVar62._4_4_ + auVar28._4_4_;
    fStack_2498 = auVar62._8_4_ + auVar28._8_4_;
    fStack_2494 = auVar62._12_4_ + auVar28._12_4_;
    fStack_2490 = auVar62._16_4_ + auVar28._16_4_;
    fStack_248c = auVar62._20_4_ + auVar28._20_4_;
    fStack_2488 = auVar62._24_4_ + auVar28._24_4_;
    fStack_2484 = auVar62._28_4_ + auVar28._28_4_;
    local_24c0 = vsubps_avx(auVar63._0_32_,auVar33);
    local_24e0._0_4_ = auVar63._0_4_ + auVar33._0_4_;
    local_24e0._4_4_ = auVar63._4_4_ + auVar33._4_4_;
    local_24e0._8_4_ = auVar63._8_4_ + auVar33._8_4_;
    local_24e0._12_4_ = auVar63._12_4_ + auVar33._12_4_;
    local_24e0._16_4_ = auVar63._16_4_ + auVar33._16_4_;
    local_24e0._20_4_ = auVar63._20_4_ + auVar33._20_4_;
    local_24e0._24_4_ = auVar63._24_4_ + auVar33._24_4_;
    local_24e0._28_4_ = auVar63._28_4_ + auVar33._28_4_;
    auVar31 = ZEXT3264(local_24e0);
    auVar64._0_4_ = fVar38 * fVar38;
    auVar64._4_4_ = fVar42 * fVar42;
    auVar64._8_4_ = fVar43 * fVar43;
    auVar64._12_4_ = fVar44 * fVar44;
    auVar64._16_4_ = fVar45 * fVar45;
    auVar64._20_4_ = fVar46 * fVar46;
    auVar64._28_36_ = in_ZMM12._28_36_;
    auVar64._24_4_ = fVar47 * fVar47;
    in_ZMM12 = ZEXT3264(auVar64._0_32_);
    local_23c0 = auVar64._0_32_;
LAB_00e64057:
    do {
      do {
        if (pauVar18 == (undefined1 (*) [16])&local_23a0) {
          return bVar13;
        }
        pauVar15 = pauVar18 + -1;
        pauVar18 = pauVar18 + -1;
      } while ((float)local_2530._0_4_ < *(float *)(*pauVar15 + 8));
      uVar16 = *(ulong *)*pauVar18;
LAB_00e64074:
      auVar25 = auVar61._0_32_;
      auVar28 = auVar62._0_32_;
      auVar33 = auVar63._0_32_;
      fVar38 = auVar31._28_4_;
      if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
        if ((uVar16 & 8) != 0) goto LAB_00e64568;
        uVar14 = uVar16 & 0xfffffffffffffff0;
        fVar42 = query->time;
        auVar26._4_4_ = fVar42;
        auVar26._0_4_ = fVar42;
        auVar26._8_4_ = fVar42;
        auVar26._12_4_ = fVar42;
        auVar26._16_4_ = fVar42;
        auVar26._20_4_ = fVar42;
        auVar26._24_4_ = fVar42;
        auVar26._28_4_ = fVar42;
        auVar29._0_4_ = fVar42 * *(float *)(uVar14 + 0x100) + *(float *)(uVar14 + 0x40);
        auVar29._4_4_ = fVar42 * *(float *)(uVar14 + 0x104) + *(float *)(uVar14 + 0x44);
        auVar29._8_4_ = fVar42 * *(float *)(uVar14 + 0x108) + *(float *)(uVar14 + 0x48);
        auVar29._12_4_ = fVar42 * *(float *)(uVar14 + 0x10c) + *(float *)(uVar14 + 0x4c);
        auVar29._16_4_ = fVar42 * *(float *)(uVar14 + 0x110) + *(float *)(uVar14 + 0x50);
        auVar29._20_4_ = fVar42 * *(float *)(uVar14 + 0x114) + *(float *)(uVar14 + 0x54);
        auVar29._24_4_ = fVar42 * *(float *)(uVar14 + 0x118) + *(float *)(uVar14 + 0x58);
        auVar29._28_4_ = fVar38 + *(float *)(uVar14 + 0x5c);
        auVar34._0_4_ = fVar42 * *(float *)(uVar14 + 0x140) + *(float *)(uVar14 + 0x80);
        auVar34._4_4_ = fVar42 * *(float *)(uVar14 + 0x144) + *(float *)(uVar14 + 0x84);
        auVar34._8_4_ = fVar42 * *(float *)(uVar14 + 0x148) + *(float *)(uVar14 + 0x88);
        auVar34._12_4_ = fVar42 * *(float *)(uVar14 + 0x14c) + *(float *)(uVar14 + 0x8c);
        auVar34._16_4_ = fVar42 * *(float *)(uVar14 + 0x150) + *(float *)(uVar14 + 0x90);
        auVar34._20_4_ = fVar42 * *(float *)(uVar14 + 0x154) + *(float *)(uVar14 + 0x94);
        auVar34._24_4_ = fVar42 * *(float *)(uVar14 + 0x158) + *(float *)(uVar14 + 0x98);
        auVar34._28_4_ = auVar37._28_4_ + *(float *)(uVar14 + 0x9c);
        auVar39._0_4_ = fVar42 * *(float *)(uVar14 + 0x180) + *(float *)(uVar14 + 0xc0);
        auVar39._4_4_ = fVar42 * *(float *)(uVar14 + 0x184) + *(float *)(uVar14 + 0xc4);
        auVar39._8_4_ = fVar42 * *(float *)(uVar14 + 0x188) + *(float *)(uVar14 + 200);
        auVar39._12_4_ = fVar42 * *(float *)(uVar14 + 0x18c) + *(float *)(uVar14 + 0xcc);
        auVar39._16_4_ = fVar42 * *(float *)(uVar14 + 400) + *(float *)(uVar14 + 0xd0);
        auVar39._20_4_ = fVar42 * *(float *)(uVar14 + 0x194) + *(float *)(uVar14 + 0xd4);
        auVar39._24_4_ = fVar42 * *(float *)(uVar14 + 0x198) + *(float *)(uVar14 + 0xd8);
        auVar39._28_4_ = auVar41._28_4_ + *(float *)(uVar14 + 0xdc);
        auVar49._0_4_ = fVar42 * *(float *)(uVar14 + 0x120) + *(float *)(uVar14 + 0x60);
        auVar49._4_4_ = fVar42 * *(float *)(uVar14 + 0x124) + *(float *)(uVar14 + 100);
        auVar49._8_4_ = fVar42 * *(float *)(uVar14 + 0x128) + *(float *)(uVar14 + 0x68);
        auVar49._12_4_ = fVar42 * *(float *)(uVar14 + 300) + *(float *)(uVar14 + 0x6c);
        auVar49._16_4_ = fVar42 * *(float *)(uVar14 + 0x130) + *(float *)(uVar14 + 0x70);
        auVar49._20_4_ = fVar42 * *(float *)(uVar14 + 0x134) + *(float *)(uVar14 + 0x74);
        auVar49._24_4_ = fVar42 * *(float *)(uVar14 + 0x138) + *(float *)(uVar14 + 0x78);
        auVar49._28_4_ = in_ZMM4._28_4_ + *(float *)(uVar14 + 0x7c);
        auVar52._0_4_ = fVar42 * *(float *)(uVar14 + 0x160) + *(float *)(uVar14 + 0xa0);
        auVar52._4_4_ = fVar42 * *(float *)(uVar14 + 0x164) + *(float *)(uVar14 + 0xa4);
        auVar52._8_4_ = fVar42 * *(float *)(uVar14 + 0x168) + *(float *)(uVar14 + 0xa8);
        auVar52._12_4_ = fVar42 * *(float *)(uVar14 + 0x16c) + *(float *)(uVar14 + 0xac);
        auVar52._16_4_ = fVar42 * *(float *)(uVar14 + 0x170) + *(float *)(uVar14 + 0xb0);
        auVar52._20_4_ = fVar42 * *(float *)(uVar14 + 0x174) + *(float *)(uVar14 + 0xb4);
        auVar52._24_4_ = fVar42 * *(float *)(uVar14 + 0x178) + *(float *)(uVar14 + 0xb8);
        auVar52._28_4_ = in_ZMM5._28_4_ + *(float *)(uVar14 + 0xbc);
        auVar60._0_4_ = fVar42 * *(float *)(uVar14 + 0x1a0) + *(float *)(uVar14 + 0xe0);
        auVar60._4_4_ = fVar42 * *(float *)(uVar14 + 0x1a4) + *(float *)(uVar14 + 0xe4);
        auVar60._8_4_ = fVar42 * *(float *)(uVar14 + 0x1a8) + *(float *)(uVar14 + 0xe8);
        auVar60._12_4_ = fVar42 * *(float *)(uVar14 + 0x1ac) + *(float *)(uVar14 + 0xec);
        auVar60._16_4_ = fVar42 * *(float *)(uVar14 + 0x1b0) + *(float *)(uVar14 + 0xf0);
        auVar60._20_4_ = fVar42 * *(float *)(uVar14 + 0x1b4) + *(float *)(uVar14 + 0xf4);
        auVar60._24_4_ = fVar42 * *(float *)(uVar14 + 0x1b8) + *(float *)(uVar14 + 0xf8);
        auVar60._28_4_ = in_ZMM6._28_4_ + *(float *)(uVar14 + 0xfc);
        auVar6 = vmaxps_avx(auVar25,auVar29);
        auVar6 = vminps_avx(auVar6,auVar49);
        auVar8 = vsubps_avx(auVar6,auVar25);
        auVar25 = vmaxps_avx(auVar28,auVar34);
        auVar25 = vminps_avx(auVar25,auVar52);
        auVar28 = vsubps_avx(auVar25,auVar28);
        auVar25 = vmaxps_avx(auVar33,auVar39);
        auVar25 = vminps_avx(auVar25,auVar60);
        auVar25 = vsubps_avx(auVar25,auVar33);
        fVar51 = auVar8._0_4_ * auVar8._0_4_;
        fVar54 = auVar8._4_4_ * auVar8._4_4_;
        auVar6._4_4_ = fVar54;
        auVar6._0_4_ = fVar51;
        fVar55 = auVar8._8_4_ * auVar8._8_4_;
        auVar6._8_4_ = fVar55;
        fVar56 = auVar8._12_4_ * auVar8._12_4_;
        auVar6._12_4_ = fVar56;
        fVar57 = auVar8._16_4_ * auVar8._16_4_;
        auVar6._16_4_ = fVar57;
        fVar58 = auVar8._20_4_ * auVar8._20_4_;
        auVar6._20_4_ = fVar58;
        fVar59 = auVar8._24_4_ * auVar8._24_4_;
        auVar6._24_4_ = fVar59;
        auVar6._28_4_ = auVar52._28_4_;
        fVar38 = auVar25._0_4_ * auVar25._0_4_;
        fVar42 = auVar25._4_4_ * auVar25._4_4_;
        auVar8._4_4_ = fVar42;
        auVar8._0_4_ = fVar38;
        fVar43 = auVar25._8_4_ * auVar25._8_4_;
        auVar8._8_4_ = fVar43;
        fVar44 = auVar25._12_4_ * auVar25._12_4_;
        auVar8._12_4_ = fVar44;
        fVar45 = auVar25._16_4_ * auVar25._16_4_;
        auVar8._16_4_ = fVar45;
        fVar46 = auVar25._20_4_ * auVar25._20_4_;
        auVar8._20_4_ = fVar46;
        fVar47 = auVar25._24_4_ * auVar25._24_4_;
        auVar8._24_4_ = fVar47;
        auVar8._28_4_ = auVar25._28_4_;
        local_2500._0_4_ = fVar51 + auVar28._0_4_ * auVar28._0_4_ + fVar38;
        local_2500._4_4_ = fVar54 + auVar28._4_4_ * auVar28._4_4_ + fVar42;
        fStack_24f8 = fVar55 + auVar28._8_4_ * auVar28._8_4_ + fVar43;
        fStack_24f4 = fVar56 + auVar28._12_4_ * auVar28._12_4_ + fVar44;
        fStack_24f0 = fVar57 + auVar28._16_4_ * auVar28._16_4_ + fVar45;
        fStack_24ec = fVar58 + auVar28._20_4_ * auVar28._20_4_ + fVar46;
        fStack_24e8 = fVar59 + auVar28._24_4_ * auVar28._24_4_ + fVar47;
        fStack_24e4 = auVar52._28_4_ + auVar28._28_4_ + auVar25._28_4_;
        auVar25 = vcmpps_avx(_local_2500,in_ZMM12._0_32_,2);
        auVar28 = vcmpps_avx(auVar29,auVar49,2);
        auVar25 = vandps_avx(auVar25,auVar28);
        auVar27 = auVar25._16_16_;
        auVar23 = vpackssdw_avx(auVar25._0_16_,auVar27);
LAB_00e6414a:
        in_ZMM6 = ZEXT3264(auVar60);
        in_ZMM5 = ZEXT3264(auVar6);
        in_ZMM4 = ZEXT3264(auVar49);
        auVar41 = ZEXT3264(auVar8);
        if (((uint)uVar16 & 7) == 6) {
          auVar25 = vcmpps_avx(*(undefined1 (*) [32])((uVar16 & 0xfffffffffffffff0) + 0x1c0),auVar26
                               ,2);
          auVar28 = vcmpps_avx(auVar26,*(undefined1 (*) [32])((uVar16 & 0xfffffffffffffff0) + 0x1e0)
                               ,1);
          auVar25 = vandps_avx(auVar25,auVar28);
          auVar27 = auVar25._16_16_;
          auVar32 = vpackssdw_avx(auVar25._0_16_,auVar27);
          auVar23 = vpand_avx(auVar32,auVar23);
        }
        auVar37 = ZEXT1664(auVar27);
        auVar31 = ZEXT1664(auVar23);
        auVar23 = vpsllw_avx(auVar23,0xf);
        if ((((((((auVar23 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar23 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar23 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar23 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar23 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar23 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar23 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar23[0xf] < '\0') {
          auVar23 = vpacksswb_avx(auVar23,auVar23);
          bVar12 = SUB161(auVar23 >> 7,0) & 1 | (SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                   (SUB161(auVar23 >> 0x17,0) & 1) << 2 | (SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                   (SUB161(auVar23 >> 0x27,0) & 1) << 4 | (SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                   (SUB161(auVar23 >> 0x37,0) & 1) << 6 | SUB161(auVar23 >> 0x3f,0) << 7;
          uVar14 = uVar16 & 0xfffffffffffffff0;
          lVar17 = 0;
          if (bVar12 != 0) {
            for (; (bVar12 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
            }
          }
          uVar16 = *(ulong *)(uVar14 + lVar17 * 8);
          uVar20 = bVar12 - 1 & (uint)bVar12;
          if (uVar20 != 0) {
            uVar3 = *(uint *)(local_2500 + lVar17 * 4);
            lVar17 = 0;
            if (uVar20 != 0) {
              for (; (uVar20 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
              }
            }
            uVar5 = *(ulong *)(uVar14 + lVar17 * 8);
            uVar4 = *(uint *)(local_2500 + lVar17 * 4);
            uVar20 = uVar20 - 1 & uVar20;
            if (uVar20 == 0) {
              if (uVar3 < uVar4) {
                *(ulong *)*pauVar18 = uVar5;
                *(uint *)(*pauVar18 + 8) = uVar4;
                pauVar18 = pauVar18 + 1;
              }
              else {
                *(ulong *)*pauVar18 = uVar16;
                *(uint *)(*pauVar18 + 8) = uVar3;
                pauVar18 = pauVar18 + 1;
                uVar16 = uVar5;
              }
            }
            else {
              auVar23._8_8_ = 0;
              auVar23._0_8_ = uVar16;
              auVar23 = vpunpcklqdq_avx(auVar23,ZEXT416(uVar3));
              auVar27._8_8_ = 0;
              auVar27._0_8_ = uVar5;
              auVar27 = vpunpcklqdq_avx(auVar27,ZEXT416(uVar4));
              lVar17 = 0;
              if (uVar20 != 0) {
                for (; (uVar20 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
                }
              }
              auVar32._8_8_ = 0;
              auVar32._0_8_ = *(ulong *)(uVar14 + lVar17 * 8);
              auVar24 = vpunpcklqdq_avx(auVar32,ZEXT416(*(uint *)(local_2500 + lVar17 * 4)));
              auVar37 = ZEXT1664(auVar24);
              auVar32 = vpcmpgtd_avx(auVar27,auVar23);
              auVar41 = ZEXT1664(auVar32);
              uVar20 = uVar20 - 1 & uVar20;
              if (uVar20 == 0) {
                auVar48 = vpshufd_avx(auVar32,0xaa);
                auVar32 = vblendvps_avx(auVar27,auVar23,auVar48);
                auVar23 = vblendvps_avx(auVar23,auVar27,auVar48);
                auVar27 = vpcmpgtd_avx(auVar24,auVar32);
                auVar48 = vpshufd_avx(auVar27,0xaa);
                auVar27 = vblendvps_avx(auVar24,auVar32,auVar48);
                auVar41 = ZEXT1664(auVar27);
                auVar32 = vblendvps_avx(auVar32,auVar24,auVar48);
                auVar31 = ZEXT1664(auVar32);
                auVar24 = vpcmpgtd_avx(auVar32,auVar23);
                auVar48 = vpshufd_avx(auVar24,0xaa);
                auVar37 = ZEXT1664(auVar48);
                auVar24 = vblendvps_avx(auVar32,auVar23,auVar48);
                in_ZMM4 = ZEXT1664(auVar24);
                auVar23 = vblendvps_avx(auVar23,auVar32,auVar48);
                *pauVar18 = auVar23;
                pauVar18[1] = auVar24;
                uVar16 = auVar27._0_8_;
                pauVar18 = pauVar18 + 2;
              }
              else {
                lVar17 = 0;
                if (uVar20 != 0) {
                  for (; (uVar20 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
                  }
                }
                in_ZMM5 = ZEXT464(*(uint *)(local_2500 + lVar17 * 4));
                auVar48._8_8_ = 0;
                auVar48._0_8_ = *(ulong *)(uVar14 + lVar17 * 8);
                auVar48 = vpunpcklqdq_avx(auVar48,ZEXT416(*(uint *)(local_2500 + lVar17 * 4)));
                in_ZMM4 = ZEXT1664(auVar48);
                uVar20 = uVar20 - 1 & uVar20;
                uVar16 = (ulong)uVar20;
                if (uVar20 == 0) {
                  auVar7 = vpshufd_avx(auVar32,0xaa);
                  auVar32 = vblendvps_avx(auVar27,auVar23,auVar7);
                  auVar23 = vblendvps_avx(auVar23,auVar27,auVar7);
                  auVar27 = vpcmpgtd_avx(auVar48,auVar24);
                  auVar7 = vpshufd_avx(auVar27,0xaa);
                  auVar27 = vblendvps_avx(auVar48,auVar24,auVar7);
                  auVar24 = vblendvps_avx(auVar24,auVar48,auVar7);
                  auVar48 = vpcmpgtd_avx(auVar24,auVar23);
                  auVar7 = vpshufd_avx(auVar48,0xaa);
                  auVar48 = vblendvps_avx(auVar24,auVar23,auVar7);
                  in_ZMM4 = ZEXT1664(auVar48);
                  auVar23 = vblendvps_avx(auVar23,auVar24,auVar7);
                  auVar24 = vpcmpgtd_avx(auVar27,auVar32);
                  auVar7 = vpshufd_avx(auVar24,0xaa);
                  auVar24 = vblendvps_avx(auVar27,auVar32,auVar7);
                  auVar37 = ZEXT1664(auVar24);
                  auVar27 = vblendvps_avx(auVar32,auVar27,auVar7);
                  auVar32 = vpcmpgtd_avx(auVar48,auVar27);
                  auVar7 = vpshufd_avx(auVar32,0xaa);
                  auVar41 = ZEXT1664(auVar7);
                  auVar32 = vblendvps_avx(auVar48,auVar27,auVar7);
                  in_ZMM5 = ZEXT1664(auVar32);
                  auVar27 = vblendvps_avx(auVar27,auVar48,auVar7);
                  auVar31 = ZEXT1664(auVar27);
                  *pauVar18 = auVar23;
                  pauVar18[1] = auVar27;
                  pauVar18[2] = auVar32;
                  uVar16 = auVar24._0_8_;
                  pauVar18 = pauVar18 + 3;
                }
                else {
                  *pauVar18 = auVar23;
                  pauVar18[1] = auVar27;
                  pauVar18[2] = auVar24;
                  pauVar15 = pauVar18 + 3;
                  pauVar18[3] = auVar48;
                  do {
                    lVar17 = 0;
                    if (uVar16 != 0) {
                      for (; (uVar16 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
                      }
                    }
                    auVar31 = ZEXT464(*(uint *)(local_2500 + lVar17 * 4));
                    auVar24._8_8_ = 0;
                    auVar24._0_8_ = *(ulong *)(uVar14 + lVar17 * 8);
                    auVar23 = vpunpcklqdq_avx(auVar24,ZEXT416(*(uint *)(local_2500 + lVar17 * 4)));
                    pauVar15[1] = auVar23;
                    pauVar15 = pauVar15 + 1;
                    uVar16 = uVar16 & uVar16 - 1;
                  } while (uVar16 != 0);
                  lVar17 = 0;
                  while (pauVar15 != pauVar18) {
                    auVar23 = pauVar18[1];
                    uVar20 = vextractps_avx(auVar23,2);
                    for (lVar19 = 0x10;
                        (lVar17 != lVar19 && (*(uint *)(pauVar18[-1] + lVar19 + 8) < uVar20));
                        lVar19 = lVar19 + -0x10) {
                      auVar31 = ZEXT1664(*(undefined1 (*) [16])(pauVar18[-1] + lVar19));
                      *(undefined1 (*) [16])(*pauVar18 + lVar19) =
                           *(undefined1 (*) [16])(pauVar18[-1] + lVar19);
                    }
                    *(undefined1 (*) [16])(*pauVar18 + lVar19) = auVar23;
                    lVar17 = lVar17 + -0x10;
                    pauVar18 = pauVar18 + 1;
                  }
                  uVar16 = *(ulong *)*pauVar15;
                  pauVar18 = pauVar15;
                }
              }
            }
          }
          goto LAB_00e64074;
        }
        goto LAB_00e64057;
      }
      if ((uVar16 & 8) == 0) {
        uVar14 = uVar16 & 0xfffffffffffffff0;
        fVar42 = query->time;
        auVar26._4_4_ = fVar42;
        auVar26._0_4_ = fVar42;
        auVar26._8_4_ = fVar42;
        auVar26._12_4_ = fVar42;
        auVar26._16_4_ = fVar42;
        auVar26._20_4_ = fVar42;
        auVar26._24_4_ = fVar42;
        auVar26._28_4_ = fVar42;
        auVar35._0_4_ = fVar42 * *(float *)(uVar14 + 0x100) + *(float *)(uVar14 + 0x40);
        auVar35._4_4_ = fVar42 * *(float *)(uVar14 + 0x104) + *(float *)(uVar14 + 0x44);
        auVar35._8_4_ = fVar42 * *(float *)(uVar14 + 0x108) + *(float *)(uVar14 + 0x48);
        auVar35._12_4_ = fVar42 * *(float *)(uVar14 + 0x10c) + *(float *)(uVar14 + 0x4c);
        auVar35._16_4_ = fVar42 * *(float *)(uVar14 + 0x110) + *(float *)(uVar14 + 0x50);
        auVar35._20_4_ = fVar42 * *(float *)(uVar14 + 0x114) + *(float *)(uVar14 + 0x54);
        auVar35._24_4_ = fVar42 * *(float *)(uVar14 + 0x118) + *(float *)(uVar14 + 0x58);
        auVar35._28_4_ = fVar38 + *(float *)(uVar14 + 0x5c);
        auVar40._0_4_ = fVar42 * *(float *)(uVar14 + 0x140) + *(float *)(uVar14 + 0x80);
        auVar40._4_4_ = fVar42 * *(float *)(uVar14 + 0x144) + *(float *)(uVar14 + 0x84);
        auVar40._8_4_ = fVar42 * *(float *)(uVar14 + 0x148) + *(float *)(uVar14 + 0x88);
        auVar40._12_4_ = fVar42 * *(float *)(uVar14 + 0x14c) + *(float *)(uVar14 + 0x8c);
        auVar40._16_4_ = fVar42 * *(float *)(uVar14 + 0x150) + *(float *)(uVar14 + 0x90);
        auVar40._20_4_ = fVar42 * *(float *)(uVar14 + 0x154) + *(float *)(uVar14 + 0x94);
        auVar40._24_4_ = fVar42 * *(float *)(uVar14 + 0x158) + *(float *)(uVar14 + 0x98);
        auVar40._28_4_ = fVar38 + *(float *)(uVar14 + 0x9c);
        auVar30._0_4_ = fVar42 * *(float *)(uVar14 + 0x180) + *(float *)(uVar14 + 0xc0);
        auVar30._4_4_ = fVar42 * *(float *)(uVar14 + 0x184) + *(float *)(uVar14 + 0xc4);
        auVar30._8_4_ = fVar42 * *(float *)(uVar14 + 0x188) + *(float *)(uVar14 + 200);
        auVar30._12_4_ = fVar42 * *(float *)(uVar14 + 0x18c) + *(float *)(uVar14 + 0xcc);
        auVar30._16_4_ = fVar42 * *(float *)(uVar14 + 400) + *(float *)(uVar14 + 0xd0);
        auVar30._20_4_ = fVar42 * *(float *)(uVar14 + 0x194) + *(float *)(uVar14 + 0xd4);
        auVar30._24_4_ = fVar42 * *(float *)(uVar14 + 0x198) + *(float *)(uVar14 + 0xd8);
        auVar30._28_4_ = fVar38 + *(float *)(uVar14 + 0xdc);
        auVar50._0_4_ = fVar42 * *(float *)(uVar14 + 0x120) + *(float *)(uVar14 + 0x60);
        auVar50._4_4_ = fVar42 * *(float *)(uVar14 + 0x124) + *(float *)(uVar14 + 100);
        auVar50._8_4_ = fVar42 * *(float *)(uVar14 + 0x128) + *(float *)(uVar14 + 0x68);
        auVar50._12_4_ = fVar42 * *(float *)(uVar14 + 300) + *(float *)(uVar14 + 0x6c);
        auVar50._16_4_ = fVar42 * *(float *)(uVar14 + 0x130) + *(float *)(uVar14 + 0x70);
        auVar50._20_4_ = fVar42 * *(float *)(uVar14 + 0x134) + *(float *)(uVar14 + 0x74);
        auVar50._24_4_ = fVar42 * *(float *)(uVar14 + 0x138) + *(float *)(uVar14 + 0x78);
        auVar50._28_4_ = in_ZMM4._28_4_ + *(float *)(uVar14 + 0x7c);
        auVar53._0_4_ = fVar42 * *(float *)(uVar14 + 0x160) + *(float *)(uVar14 + 0xa0);
        auVar53._4_4_ = fVar42 * *(float *)(uVar14 + 0x164) + *(float *)(uVar14 + 0xa4);
        auVar53._8_4_ = fVar42 * *(float *)(uVar14 + 0x168) + *(float *)(uVar14 + 0xa8);
        auVar53._12_4_ = fVar42 * *(float *)(uVar14 + 0x16c) + *(float *)(uVar14 + 0xac);
        auVar53._16_4_ = fVar42 * *(float *)(uVar14 + 0x170) + *(float *)(uVar14 + 0xb0);
        auVar53._20_4_ = fVar42 * *(float *)(uVar14 + 0x174) + *(float *)(uVar14 + 0xb4);
        auVar53._24_4_ = fVar42 * *(float *)(uVar14 + 0x178) + *(float *)(uVar14 + 0xb8);
        auVar53._28_4_ = in_ZMM5._28_4_ + *(float *)(uVar14 + 0xbc);
        auVar60._0_4_ = fVar42 * *(float *)(uVar14 + 0x1a0) + *(float *)(uVar14 + 0xe0);
        auVar60._4_4_ = fVar42 * *(float *)(uVar14 + 0x1a4) + *(float *)(uVar14 + 0xe4);
        auVar60._8_4_ = fVar42 * *(float *)(uVar14 + 0x1a8) + *(float *)(uVar14 + 0xe8);
        auVar60._12_4_ = fVar42 * *(float *)(uVar14 + 0x1ac) + *(float *)(uVar14 + 0xec);
        auVar60._16_4_ = fVar42 * *(float *)(uVar14 + 0x1b0) + *(float *)(uVar14 + 0xf0);
        auVar60._20_4_ = fVar42 * *(float *)(uVar14 + 0x1b4) + *(float *)(uVar14 + 0xf4);
        auVar60._24_4_ = fVar42 * *(float *)(uVar14 + 0x1b8) + *(float *)(uVar14 + 0xf8);
        auVar60._28_4_ = in_ZMM6._28_4_ + *(float *)(uVar14 + 0xfc);
        auVar6 = vmaxps_avx(auVar25,auVar35);
        auVar6 = vminps_avx(auVar6,auVar50);
        auVar6 = vsubps_avx(auVar6,auVar25);
        auVar25 = vmaxps_avx(auVar28,auVar40);
        auVar25 = vminps_avx(auVar25,auVar53);
        auVar28 = vsubps_avx(auVar25,auVar28);
        auVar25 = vmaxps_avx(auVar33,auVar30);
        auVar25 = vminps_avx(auVar25,auVar60);
        auVar25 = vsubps_avx(auVar25,auVar33);
        local_2500._4_4_ =
             auVar25._4_4_ * auVar25._4_4_ +
             auVar28._4_4_ * auVar28._4_4_ + auVar6._4_4_ * auVar6._4_4_;
        local_2500._0_4_ =
             auVar25._0_4_ * auVar25._0_4_ +
             auVar28._0_4_ * auVar28._0_4_ + auVar6._0_4_ * auVar6._0_4_;
        fStack_24f8 = auVar25._8_4_ * auVar25._8_4_ +
                      auVar28._8_4_ * auVar28._8_4_ + auVar6._8_4_ * auVar6._8_4_;
        fStack_24f4 = auVar25._12_4_ * auVar25._12_4_ +
                      auVar28._12_4_ * auVar28._12_4_ + auVar6._12_4_ * auVar6._12_4_;
        fStack_24f0 = auVar25._16_4_ * auVar25._16_4_ +
                      auVar28._16_4_ * auVar28._16_4_ + auVar6._16_4_ * auVar6._16_4_;
        fStack_24ec = auVar25._20_4_ * auVar25._20_4_ +
                      auVar28._20_4_ * auVar28._20_4_ + auVar6._20_4_ * auVar6._20_4_;
        fStack_24e8 = auVar25._24_4_ * auVar25._24_4_ +
                      auVar28._24_4_ * auVar28._24_4_ + auVar6._24_4_ * auVar6._24_4_;
        fStack_24e4 = auVar25._28_4_ + auVar28._28_4_ + auVar6._28_4_;
        auVar25 = vcmpps_avx(auVar35,auVar50,2);
        auVar28 = vcmpps_avx(auVar53,local_2480,5);
        auVar6 = vandps_avx(auVar25,auVar28);
        auVar10._4_4_ = fStack_245c;
        auVar10._0_4_ = local_2460;
        auVar10._8_4_ = fStack_2458;
        auVar10._12_4_ = fStack_2454;
        auVar10._16_4_ = fStack_2450;
        auVar10._20_4_ = fStack_244c;
        auVar10._24_4_ = fStack_2448;
        auVar10._28_4_ = fStack_2444;
        auVar25 = vcmpps_avx(auVar35,auVar10,2);
        auVar9._4_4_ = fStack_249c;
        auVar9._0_4_ = local_24a0;
        auVar9._8_4_ = fStack_2498;
        auVar9._12_4_ = fStack_2494;
        auVar9._16_4_ = fStack_2490;
        auVar9._20_4_ = fStack_248c;
        auVar9._24_4_ = fStack_2488;
        auVar9._28_4_ = fStack_2484;
        auVar28 = vcmpps_avx(auVar40,auVar9,2);
        auVar25 = vandps_avx(auVar28,auVar25);
        auVar28 = vcmpps_avx(auVar60,local_24c0,5);
        auVar8 = vandps_avx(auVar6,auVar28);
        auVar49 = vcmpps_avx(auVar50,local_2440,5);
        auVar28 = vcmpps_avx(auVar30,local_24e0,2);
        auVar28 = vandps_avx(auVar28,auVar49);
        auVar25 = vandps_avx(auVar25,auVar28);
        auVar25 = vandps_avx(auVar25,auVar8);
        auVar36._8_4_ = 0xffff;
        auVar36._0_8_ = 0xffff0000ffff;
        auVar36._12_4_ = 0xffff;
        auVar36._16_4_ = 0xffff;
        auVar36._20_4_ = 0xffff;
        auVar36._24_4_ = 0xffff;
        auVar36._28_4_ = 0xffff;
        auVar25 = vandps_avx(auVar25,auVar36);
        auVar27 = auVar25._16_16_;
        auVar23 = vpackusdw_avx(auVar25._0_16_,auVar27);
        goto LAB_00e6414a;
      }
LAB_00e64568:
      lVar19 = (uVar16 & 0xfffffffffffffff0) + 0x40;
      bVar12 = 0;
      for (lVar17 = 0; lVar17 != (ulong)((uint)uVar16 & 0xf) - 8; lVar17 = lVar17 + 1) {
        bVar22 = 0;
        for (lVar21 = 0; (lVar21 != 4 && (*(int *)(lVar19 + lVar21 * 4) != -1)); lVar21 = lVar21 + 1
            ) {
          uVar20 = *(uint *)(lVar19 + -0x10 + lVar21 * 4);
          this = (context->scene->geometries).items[uVar20].ptr;
          context->geomID = uVar20;
          context->primID = *(uint *)(lVar19 + lVar21 * 4);
          auVar31 = ZEXT1664(auVar31._0_16_);
          auVar37 = ZEXT1664(auVar37._0_16_);
          auVar41 = ZEXT1664(auVar41._0_16_);
          in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
          in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
          in_ZMM6 = ZEXT1664(in_ZMM6._0_16_);
          bVar11 = Geometry::pointQuery(this,query,context);
          in_ZMM12 = ZEXT3264(local_23c0);
          auVar63 = ZEXT3264(local_2420);
          auVar62 = ZEXT3264(local_2400);
          auVar61 = ZEXT3264(local_23e0);
          bVar22 = bVar22 | bVar11;
        }
        bVar12 = bVar12 | bVar22;
        lVar19 = lVar19 + 0x50;
      }
    } while (bVar12 == 0);
    uVar1 = *(undefined4 *)&(context->query_radius).field_0;
    auVar25._4_4_ = uVar1;
    auVar25._0_4_ = uVar1;
    auVar25._8_4_ = uVar1;
    auVar25._12_4_ = uVar1;
    auVar25._16_4_ = uVar1;
    auVar25._20_4_ = uVar1;
    auVar25._24_4_ = uVar1;
    auVar25._28_4_ = uVar1;
    uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar28._4_4_ = uVar1;
    auVar28._0_4_ = uVar1;
    auVar28._8_4_ = uVar1;
    auVar28._12_4_ = uVar1;
    auVar28._16_4_ = uVar1;
    auVar28._20_4_ = uVar1;
    auVar28._24_4_ = uVar1;
    auVar28._28_4_ = uVar1;
    uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar33._4_4_ = uVar1;
    auVar33._0_4_ = uVar1;
    auVar33._8_4_ = uVar1;
    auVar33._12_4_ = uVar1;
    auVar33._16_4_ = uVar1;
    auVar33._20_4_ = uVar1;
    auVar33._24_4_ = uVar1;
    auVar33._28_4_ = uVar1;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_2530 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      aVar2 = (context->query_radius).field_0;
      local_2530 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
    }
    bVar13 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }